

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void ngai_elem2_patch_(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,
                      Integer g_c,Integer *clo,Integer *chi,int op)

{
  int iVar1;
  Integer IVar2;
  Integer IVar3;
  Integer IVar4;
  logical lVar5;
  Integer IVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  Integer g_A;
  Integer g_B;
  char *C_ptr;
  char *A_ptr;
  Integer bndim;
  Integer andim;
  char *B_ptr;
  Integer ctype;
  Integer atype;
  Integer loC [7];
  Integer hiC [7];
  Integer btype;
  int lod [7];
  Integer hiB [7];
  Integer loB [7];
  Integer hiA [7];
  Integer loA [7];
  Integer ldC [7];
  Integer ldB [7];
  Integer ldA [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_a;
  _iterator_hdl hdl_c;
  _iterator_hdl hdl_b;
  char local_cb9;
  long local_cb8;
  Integer local_cb0;
  Integer local_ca8;
  char *local_ca0;
  char *local_c98;
  long local_c90;
  long local_c88;
  Integer local_c80;
  Integer local_c78;
  char *local_c70;
  Integer local_c68;
  int local_c5c;
  long local_c58;
  long local_c50;
  Integer local_c48 [8];
  Integer local_c08 [7];
  long local_bd0;
  int aiStack_bc8 [8];
  Integer local_ba8 [8];
  Integer local_b68 [8];
  Integer local_b28 [8];
  Integer local_ae8 [8];
  Integer local_aa8 [8];
  Integer local_a68 [8];
  Integer local_a28 [8];
  Integer local_9e8 [8];
  Integer local_9a8 [8];
  Integer local_968 [7];
  _iterator_hdl local_930;
  _iterator_hdl local_630;
  _iterator_hdl local_330;
  
  local_cb0 = g_a;
  local_ca8 = g_b;
  local_c80 = g_a;
  local_c78 = g_b;
  local_c68 = pnga_nodeid();
  local_cb9 = 'n';
  bVar11 = _ga_sync_begin != 0;
  local_c5c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  IVar6 = local_c80;
  pnga_check_handle(local_c80,"gai_elem2_patch_");
  pnga_inquire(IVar6,&local_c50,&local_c88,local_968);
  pnga_inquire(local_c78,&local_bd0,&local_c90,local_9a8);
  pnga_inquire(g_c,&local_c58,&local_cb8,local_9e8);
  if ((local_c50 != local_bd0) || (local_c50 != local_c58)) {
    pnga_error(" types mismatch ",0);
  }
  if (0 < local_c88) {
    lVar8 = 0;
    do {
      if ((alo[lVar8] < 1) || (local_968[lVar8] < ahi[lVar8])) {
        pnga_error("g_a indices out of range ",local_c80);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_c88);
  }
  if (0 < local_c90) {
    lVar8 = 0;
    do {
      if ((blo[lVar8] < 1) || (local_9a8[lVar8] < bhi[lVar8])) {
        pnga_error("g_b indices out of range ",local_c78);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_c90);
  }
  if (0 < local_cb8) {
    lVar8 = 0;
    do {
      if ((clo[lVar8] < 1) || (local_9e8[lVar8] < chi[lVar8])) {
        pnga_error("g_c indices out of range ",g_c);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_cb8);
  }
  lVar7 = 1;
  lVar8 = 1;
  if (0 < local_cb8) {
    lVar9 = 0;
    do {
      lVar8 = lVar8 * ((chi[lVar9] - clo[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (local_cb8 != lVar9);
  }
  if (0 < local_c88) {
    lVar7 = 1;
    lVar9 = 0;
    do {
      lVar7 = lVar7 * ((ahi[lVar9] - alo[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (local_c88 != lVar9);
  }
  lVar9 = 1;
  if (0 < local_c90) {
    lVar10 = 0;
    do {
      lVar9 = lVar9 * ((bhi[lVar10] - blo[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (local_c90 != lVar10);
  }
  if ((lVar7 != lVar8) || (lVar9 != lVar8)) {
    pnga_error("  capacities of patches do not match ",0);
  }
  IVar2 = pnga_total_blocks(local_c80);
  IVar3 = pnga_total_blocks(local_c78);
  IVar4 = pnga_total_blocks(g_c);
  IVar6 = local_c68;
  if (((-1 < IVar2) || (-1 < IVar3)) || (-1 < IVar4)) {
    lVar5 = pnga_duplicate(g_c,&local_cb0,"temp");
    if (lVar5 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&local_cb9,local_c80,alo,ahi,local_cb0,clo,chi);
    local_c88 = local_cb8;
    lVar5 = pnga_duplicate(g_c,&local_ca8,"temp");
    if (lVar5 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&local_cb9,local_c78,blo,bhi,local_ca8,clo,chi);
    local_c90 = local_cb8;
    pnga_local_iterator_init(local_cb0,&local_930);
    pnga_local_iterator_init(local_ca8,&local_330);
    pnga_local_iterator_init(g_c,&local_630);
    iVar1 = pnga_local_iterator_next(&local_630,local_c48,local_c08,&local_ca0,local_aa8);
    if (iVar1 != 0) {
      do {
        pnga_local_iterator_next(&local_930,local_ae8,local_b28,&local_c98,local_a28);
        pnga_local_iterator_next(&local_330,local_b68,local_ba8,&local_c70,local_a68);
        if (0 < local_cb8) {
          lVar8 = 0;
          do {
            aiStack_bc8[lVar8] = (int)local_c48[lVar8];
            lVar8 = lVar8 + 1;
          } while (local_cb8 != lVar8);
        }
        lVar5 = pnga_patch_intersect(clo,chi,local_c48,local_c08,local_cb8);
        if (lVar5 != 0) {
          if (local_cb8 < 2) {
            lVar8 = 1;
            lVar7 = 0;
          }
          else {
            lVar8 = 1;
            lVar7 = 0;
            lVar9 = 0;
            do {
              lVar7 = lVar7 + (local_c48[lVar9] - (long)aiStack_bc8[lVar9]) * lVar8;
              lVar8 = lVar8 * local_aa8[lVar9];
              lVar9 = lVar9 + 1;
            } while (local_cb8 + -1 != lVar9);
          }
          if (local_c58 - 0x3e9U < 7) {
            lVar7 = (local_c48[local_cb8 + -1] - (long)aiStack_bc8[local_cb8 + -1]) * lVar8 + lVar7;
            switch(local_c58) {
            case 0x3e9:
            case 0x3eb:
              lVar7 = lVar7 * 4;
              break;
            default:
              lVar7 = lVar7 * 8;
              break;
            case 0x3ed:
              goto switchD_0010a8d2_caseD_3ed;
            case 0x3ef:
              lVar7 = lVar7 * 0x10;
            }
            local_c98 = local_c98 + lVar7;
            local_c70 = local_c70 + lVar7;
            local_ca0 = local_ca0 + lVar7;
          }
switchD_0010a8d2_caseD_3ed:
          ngai_do_elem2_oper(local_c50,local_cb8,local_c48,local_c08,local_aa8,local_c98,local_c70,
                             local_ca0,op);
        }
        pnga_release(local_cb0,local_c48,local_c08);
        pnga_release(local_ca8,local_c48,local_c08);
        pnga_release_update(g_c,local_c48,local_c08);
        iVar1 = pnga_local_iterator_next(&local_630,local_c48,local_c08,&local_ca0,local_aa8);
      } while (iVar1 != 0);
    }
    IVar2 = 1;
    IVar6 = 1;
    goto LAB_0010ad2c;
  }
  pnga_distribution(local_cb0,local_c68,local_ae8,local_b28);
  pnga_distribution(local_ca8,IVar6,local_b68,local_ba8);
  pnga_distribution(g_c,IVar6,local_c48,local_c08);
  lVar5 = pnga_comp_patch(local_c88,local_ae8,local_b28,local_cb8,local_c48,local_c08);
  if (lVar5 == 0) {
LAB_0010a617:
    local_930.g_a = 0;
  }
  else {
    lVar5 = pnga_comp_patch(local_c88,alo,ahi,local_cb8,clo,chi);
    local_930.g_a = 1;
    if (lVar5 == 0) goto LAB_0010a617;
  }
  IVar6 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar6,&local_930,1,"&&");
  if (local_930.g_a == 0) {
    if (local_c78 == g_c) {
      lVar5 = pnga_duplicate(g_c,&local_cb0,"temp");
      if (lVar5 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&local_cb9,local_c80,alo,ahi,local_cb0,clo,chi);
      IVar2 = 1;
    }
    else {
      pnga_copy_patch(&local_cb9,local_c80,alo,ahi,g_c,clo,chi);
      local_cb0 = g_c;
      IVar2 = 0;
    }
    local_c88 = local_cb8;
    pnga_distribution(local_cb0,local_c68,local_ae8,local_b28);
  }
  else {
    IVar2 = 0;
  }
  lVar5 = pnga_comp_patch(local_c90,local_b68,local_ba8,local_cb8,local_c48,local_c08);
  if (lVar5 == 0) {
LAB_0010aabf:
    local_930.g_a = 0;
  }
  else {
    lVar5 = pnga_comp_patch(local_c90,blo,bhi,local_cb8,clo,chi);
    local_930.g_a = 1;
    if (lVar5 == 0) goto LAB_0010aabf;
  }
  IVar6 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar6,&local_930,1,"&&");
  if (local_930.g_a == 0) {
    lVar5 = pnga_duplicate(g_c,&local_ca8,"temp");
    if (lVar5 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&local_cb9,local_c78,blo,bhi,local_ca8,clo,chi);
    local_c90 = local_cb8;
    pnga_distribution(local_ca8,local_c68,local_b68,local_ba8);
    IVar6 = 1;
  }
  else {
    IVar6 = 0;
  }
  if ((local_c88 != local_c90) && (local_cb8 = local_c90, local_c88 < local_c90)) {
    local_cb8 = local_c88;
  }
  lVar5 = pnga_comp_patch(local_c88,local_ae8,local_b28,local_cb8,local_c48,local_c08);
  if (lVar5 == 0) {
    pnga_error(" A patch mismatch ",local_cb0);
  }
  lVar5 = pnga_comp_patch(local_c90,local_b68,local_ba8,local_cb8,local_c48,local_c08);
  if (lVar5 == 0) {
    pnga_error(" B patch mismatch ",local_ca8);
  }
  lVar5 = pnga_patch_intersect(clo,chi,local_c48,local_c08,local_cb8);
  if (lVar5 != 0) {
    local_c80 = IVar6;
    local_c78 = IVar2;
    pnga_access_ptr(local_cb0,local_c48,local_c08,&local_c98,local_a28);
    pnga_access_ptr(local_ca8,local_c48,local_c08,&local_c70,local_a68);
    pnga_access_ptr(g_c,local_c48,local_c08,&local_ca0,local_aa8);
    ngai_do_elem2_oper(local_c50,local_cb8,local_c48,local_c08,local_aa8,local_c98,local_c70,
                       local_ca0,op);
    pnga_release(local_cb0,local_c48,local_c08);
    pnga_release(local_ca8,local_c48,local_c08);
    IVar2 = local_c78;
    IVar6 = local_c80;
    pnga_release_update(g_c,local_c48,local_c08);
  }
LAB_0010ad2c:
  if (IVar2 != 0) {
    pnga_destroy(local_cb0);
  }
  if (IVar6 != 0) {
    pnga_destroy(local_ca8);
  }
  if (local_c5c != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

static void ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,
                              g_c, clo, chi, op)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
int op; /* operation to be perform between g_a and g_b */
{
  Integer i, j;
  Integer compatible;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer idx, n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();
  pnga_check_handle(g_a, "gai_elem2_patch_");

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_A, me, loA, hiA);
    pnga_distribution(g_B, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
        pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      }
      else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
    }

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
        pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);
    }        

    if(andim > bndim) cndim = bndim;
    if(andim < bndim) cndim = andim;

    if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
      pnga_error(" A patch mismatch ", g_A); 
    if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
      pnga_error(" B patch mismatch ", g_B);

    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
      pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
      pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
      pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

      /* compute "local" operation accoording to op */
      ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC); 
      pnga_release_update(g_c, loC, hiC); 

    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    int lod[MAXDIM];
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

    /* C is normally distributed so just add copies together for regular
       arrays */
#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);

      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
        Integer offset, last, jtot;
        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;
        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC,
            A_ptr, B_ptr, C_ptr, op);
      }
      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC);
      pnga_release_update(g_c, loC, hiC);
    }
#else
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        /* compute "local" operation accoording to op */
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC);
        pnga_release_update(g_c, loC, hiC);
      }
    } else {
      Integer lod[MAXDIM];
      /* Integer hid[MAXDIM]; */
      /* Integer chk; */
      Integer offset, last, jtot;
      if (!pnga_uses_proc_grid(g_c)) {
        Integer nproc = pnga_nnodes();
        for (idx = me; idx < num_blocks_c; idx += nproc) {

          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx);
            pnga_release_update_block(g_c, idx);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /* chk = 1; */
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /* if (hiC[i] < loC[i]) chk = 0; */
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block_grid       (g_A, index);
            pnga_release_block_grid       (g_B, index);
            pnga_release_update_block_grid(g_c, index);
          }
          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}